

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int c1fm1f_(int *n,int *inc,fft_complex_t *c__,double *ch,double *wa,double *fnf,double *fac)

{
  double *wa_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  fft_complex_t *pfVar5;
  int iVar6;
  fft_complex_t *pfVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  int na;
  int l1;
  int inc2;
  int ido;
  fft_complex_t *local_60;
  fft_complex_t *local_58;
  int lid;
  int ip;
  double *local_48;
  ulong local_40;
  int *local_38;
  
  inc2 = *inc * 2;
  na = 0;
  l1 = 1;
  if (0 < (int)*fnf) {
    local_48 = wa + -1;
    local_40 = (ulong)(uint)(int)*fnf;
    uVar8 = 0;
    iVar9 = 1;
    iVar2 = 0;
    local_60 = c__;
    local_58 = (fft_complex_t *)ch;
    local_38 = n;
    do {
      iVar10 = (int)fac[uVar8];
      iVar6 = l1 * iVar10;
      iVar1 = *local_38 / iVar6;
      lid = l1 * iVar1;
      iVar4 = 6;
      if (iVar10 < 6) {
        iVar4 = iVar10;
      }
      wa_00 = local_48 + iVar9;
      ido = iVar1;
      ip = iVar10;
      switch(iVar2 + iVar4 * 2) {
      case 5:
        piVar11 = &c__2;
        piVar3 = &inc2;
        pfVar5 = local_58;
        pfVar7 = local_60;
        break;
      case 6:
        piVar11 = &inc2;
        piVar3 = &c__2;
        pfVar5 = local_60;
        pfVar7 = local_58;
        goto LAB_001101f7;
      case 7:
        piVar11 = &c__2;
        piVar3 = &inc2;
        pfVar5 = local_58;
        pfVar7 = local_60;
LAB_001101f7:
        c1f3kf_(&ido,&l1,&na,&pfVar5->r,piVar11,&pfVar7->r,piVar3,wa_00);
        goto LAB_001102c9;
      case 8:
        piVar11 = &inc2;
        piVar3 = &c__2;
        pfVar5 = local_60;
        pfVar7 = local_58;
        goto LAB_0011018e;
      case 9:
        piVar11 = &c__2;
        piVar3 = &inc2;
        pfVar5 = local_58;
        pfVar7 = local_60;
LAB_0011018e:
        c1f4kf_(&ido,&l1,&na,&pfVar5->r,piVar11,&pfVar7->r,piVar3,wa_00);
        goto LAB_001102c9;
      case 10:
        piVar3 = &inc2;
        piVar11 = &c__2;
        pfVar5 = local_60;
        pfVar7 = local_58;
        goto LAB_00110250;
      case 0xb:
        piVar3 = &c__2;
        piVar11 = &inc2;
        pfVar5 = local_58;
        pfVar7 = local_60;
LAB_00110250:
        c1f5kf_(&ido,&l1,&na,&pfVar5->r,piVar3,&pfVar7->r,piVar11,wa_00);
        goto LAB_001102c9;
      case 0xc:
        piVar11 = &c__2;
        piVar3 = &inc2;
        pfVar5 = local_60;
        pfVar7 = local_58;
        goto LAB_0011028b;
      case 0xd:
        piVar11 = &inc2;
        piVar3 = &c__2;
        pfVar5 = local_58;
        pfVar7 = local_60;
LAB_0011028b:
        c1fgkf_(&ido,&ip,&l1,&lid,&na,&pfVar5->r,&pfVar5->r,piVar3,&pfVar7->r,&pfVar7->r,piVar11,
                wa_00);
        goto LAB_001102c9;
      default:
        piVar11 = &inc2;
        piVar3 = &c__2;
        pfVar5 = local_60;
        pfVar7 = local_58;
      }
      c1f2kf_(&ido,&l1,&na,&pfVar5->r,piVar11,&pfVar7->r,piVar3,wa_00);
LAB_001102c9:
      if (iVar10 < 6) {
        iVar2 = 1 - iVar2;
        na = iVar2;
      }
      iVar9 = iVar9 + (iVar10 * 2 + -2) * iVar1;
      uVar8 = uVar8 + 1;
      l1 = iVar6;
    } while (local_40 != uVar8);
  }
  return 0;
}

Assistant:

int c1fm1f_(int *n, int *inc, complex *c__, fft_real_t *ch,
	 fft_real_t *wa, fft_real_t *fnf, fft_real_t *fac)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
     int k1, l1, l2, na, nf, ip, iw, lid, ido, nbr, inc2;
    extern /* Subroutine */ int c1f2kf_(int *, int *, int *, fft_real_t
	    *, int *, fft_real_t *, int *, fft_real_t *), c1f3kf_(int *,
	    int *, int *, fft_real_t *, int *, fft_real_t *, int *, fft_real_t *
	    ), c1f4kf_(int *, int *, int *, fft_real_t *, int *,
	    fft_real_t *, int *, fft_real_t *), c1f5kf_(int *, int *, int
	    *, fft_real_t *, int *, fft_real_t *, int *, fft_real_t *), c1fgkf_(int
	    *, int *, int *, int *, int *, fft_real_t *, fft_real_t *,
	    int *, fft_real_t *, fft_real_t *, int *, fft_real_t *);


/* FFTPACK 5.1 auxiliary routine */

    /* Parameter adjustments */
    --fac;
    --wa;
    --ch;
    --c__;

    /* Function Body */
    inc2 = *inc + *inc;
    nf = *fnf;
    na = 0;
    l1 = 1;
    iw = 1;
    i__1 = nf;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1];
	l2 = ip * l1;
	ido = *n / l2;
	lid = l1 * ido;
/* Computing MIN */
	i__2 = ip - 2;
	nbr = na + 1 + (min(i__2,4) << 1);
	switch (nbr) {
	    case 1:  goto L52;
	    case 2:  goto L62;
	    case 3:  goto L53;
	    case 4:  goto L63;
	    case 5:  goto L54;
	    case 6:  goto L64;
	    case 7:  goto L55;
	    case 8:  goto L65;
	    case 9:  goto L56;
	    case 10:  goto L66;
	}
L52:
	c1f2kf_(&ido, &l1, &na, (fft_real_t*)&c__[1], &inc2, &ch[1], &c__2, &wa[iw])
		;
	goto L120;
L62:
	c1f2kf_(&ido, &l1, &na, &ch[1], &c__2, (fft_real_t*)&c__[1], &inc2, &wa[iw])
		;
	goto L120;
L53:
	c1f3kf_(&ido, &l1, &na, (fft_real_t*)&c__[1], &inc2, &ch[1], &c__2, &wa[iw])
		;
	goto L120;
L63:
	c1f3kf_(&ido, &l1, &na, &ch[1], &c__2, (fft_real_t*)&c__[1], &inc2, &wa[iw])
		;
	goto L120;
L54:
	c1f4kf_(&ido, &l1, &na, (fft_real_t*)&c__[1], &inc2, &ch[1], &c__2, &wa[iw])
		;
	goto L120;
L64:
	c1f4kf_(&ido, &l1, &na, &ch[1], &c__2, (fft_real_t*)&c__[1], &inc2, &wa[iw])
		;
	goto L120;
L55:
	c1f5kf_(&ido, &l1, &na, (fft_real_t*)&c__[1], &inc2, &ch[1], &c__2, &wa[iw])
		;
	goto L120;
L65:
	c1f5kf_(&ido, &l1, &na, &ch[1], &c__2, (fft_real_t*)&c__[1], &inc2, &wa[iw])
		;
	goto L120;
L56:
	c1fgkf_(&ido, &ip, &l1, &lid, &na, (fft_real_t*)&c__[1], (fft_real_t*)&c__[1], &
		inc2, &ch[1], &ch[1], &c__2, &wa[iw]);
	goto L120;
L66:
	c1fgkf_(&ido, &ip, &l1, &lid, &na, &ch[1], &ch[1], &c__2, (fft_real_t*)&c__[
		1], (fft_real_t*)&c__[1], &inc2, &wa[iw]);
L120:
	l1 = l2;
	iw += (ip - 1) * (ido + ido);
	if (ip <= 5) {
	    na = 1 - na;
	}
/* L125: */
    }
    return 0;
}